

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_alpn_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  SSL *pSVar1;
  SSL3_STATE *pSVar2;
  bool bVar3;
  int iVar4;
  CBB proto;
  CBB proto_list;
  CBB contents;
  
  pSVar1 = hs->ssl;
  if ((pSVar1->s3->alpn_selected).size_ == 0) {
    bVar3 = true;
  }
  else {
    iVar4 = CBB_add_u16(out,0x10);
    if ((((iVar4 != 0) && (iVar4 = CBB_add_u16_length_prefixed(out,&contents), iVar4 != 0)) &&
        (iVar4 = CBB_add_u16_length_prefixed(&contents,&proto_list), iVar4 != 0)) &&
       ((iVar4 = CBB_add_u8_length_prefixed(&proto_list,&proto), iVar4 != 0 &&
        (pSVar2 = pSVar1->s3,
        iVar4 = CBB_add_bytes(&proto,(pSVar2->alpn_selected).data_,(pSVar2->alpn_selected).size_),
        iVar4 != 0)))) {
      iVar4 = CBB_flush(out);
      return iVar4 != 0;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool ext_alpn_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  if (ssl->s3->alpn_selected.empty()) {
    return true;
  }

  CBB contents, proto_list, proto;
  if (!CBB_add_u16(out, TLSEXT_TYPE_application_layer_protocol_negotiation) ||
      !CBB_add_u16_length_prefixed(out, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &proto_list) ||
      !CBB_add_u8_length_prefixed(&proto_list, &proto) ||
      !CBB_add_bytes(&proto, ssl->s3->alpn_selected.data(),
                     ssl->s3->alpn_selected.size()) ||
      !CBB_flush(out)) {
    return false;
  }

  return true;
}